

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

bool isFunctParam(ProKey *variableName)

{
  uint uVar1;
  ulong uVar2;
  char16_t *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (variableName->super_ProString).m_length;
  pcVar3 = (variableName->super_ProString).m_string.d.ptr;
  if (pcVar3 == (char16_t *)0x0) {
    pcVar3 = (char16_t *)&QString::_empty;
  }
  uVar4 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  do {
    uVar5 = uVar2;
    if (uVar4 == uVar5) break;
    uVar2 = uVar5 + 1;
  } while ((ushort)(pcVar3[(long)(variableName->super_ProString).m_offset + uVar5] + L'￐') < 10);
  return (long)(int)uVar1 <= (long)uVar5;
}

Assistant:

const QChar *constData() const { return m_string.constData() + m_offset; }